

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

Vec_Int_t * Acb_ObjCollectTfoVec(Acb_Ntk_t *p,Vec_Int_t *vObjs)

{
  int iVar1;
  int local_1c;
  int iObj;
  int i;
  Vec_Int_t *vObjs_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_NtkHasObjFanout(p);
  if (iVar1 == 0) {
    Acb_NtkCreateFanout(p);
  }
  Vec_IntClear(&p->vArray1);
  Acb_NtkIncTravId(p);
  for (local_1c = 0; iVar1 = Vec_IntSize(vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    iVar1 = Vec_IntEntry(vObjs,local_1c);
    Acb_ObjCollectTfo_rec(p,iVar1,0);
  }
  return &p->vArray1;
}

Assistant:

Vec_Int_t * Acb_ObjCollectTfoVec( Acb_Ntk_t * p, Vec_Int_t * vObjs )
{
    int i, iObj;
    if ( !Acb_NtkHasObjFanout(p) )
        Acb_NtkCreateFanout( p );
    Vec_IntClear( &p->vArray1 );
    Acb_NtkIncTravId( p );
    Vec_IntForEachEntry( vObjs, iObj, i )
        Acb_ObjCollectTfo_rec( p, iObj, 0 );
    return &p->vArray1;
}